

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O0

vector<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* wallet::ListDatabases_abi_cxx11_(path *wallet_dir)

{
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar1;
  bool bVar2;
  file_type fVar3;
  bool bVar4;
  int iVar5;
  vector<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  exception *e;
  vector<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *paths;
  recursive_directory_iterator it;
  error_code ec;
  path path;
  undefined4 in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9ac;
  ConstevalFormatString<3U> in_stack_fffffffffffff9b0;
  char *in_stack_fffffffffffff9b8;
  path *in_stack_fffffffffffff9c0;
  path *in_stack_fffffffffffff9c8;
  path *in_stack_fffffffffffff9d8;
  undefined7 in_stack_fffffffffffff9e0;
  format in_stack_fffffffffffff9e7;
  char (*in_stack_fffffffffffff9e8) [11];
  undefined7 in_stack_fffffffffffff9f0;
  byte in_stack_fffffffffffff9f7;
  path *in_stack_fffffffffffffa08;
  undefined5 in_stack_fffffffffffffa10;
  byte in_stack_fffffffffffffa15;
  byte bVar6;
  byte in_stack_fffffffffffffa16;
  byte in_stack_fffffffffffffa17;
  undefined8 in_stack_fffffffffffffa18;
  path *path_00;
  ConstevalFormatString<3U> in_stack_fffffffffffffa58;
  char *pcVar7;
  directory_entry *in_stack_fffffffffffffa60;
  char *in_stack_fffffffffffffa68;
  undefined1 in_stack_fffffffffffffa70 [15];
  undefined1 uVar8;
  recursive_directory_iterator local_4f8;
  error_code local_4e8;
  path local_4d8;
  Level in_stack_fffffffffffffb50;
  char (*in_stack_fffffffffffffb60) [14];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb70;
  char local_408 [128];
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  path local_178 [4];
  undefined1 local_d8 [144];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = 0;
  std::
  vector<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
  path_00 = &local_4d8;
  std::error_code::error_code
            ((error_code *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)in_stack_fffffffffffff9b8,
             (path *)in_stack_fffffffffffff9b0.fmt,
             (error_code *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
  while( true ) {
    memset(&local_4f8,0,0x10);
    std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
              ((recursive_directory_iterator *)
               CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
    bVar2 = std::filesystem::__cxx11::operator!=
                      ((recursive_directory_iterator *)in_stack_fffffffffffff9b8,
                       (recursive_directory_iterator *)in_stack_fffffffffffff9b0.fmt);
    std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
              (&local_4f8);
    if (!bVar2) break;
    bVar2 = std::error_code::operator_cast_to_bool
                      ((error_code *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
    if (bVar2) {
      std::filesystem::__cxx11::recursive_directory_iterator::operator*
                ((recursive_directory_iterator *)&local_4e8);
      std::filesystem::__cxx11::directory_entry::operator_cast_to_path_
                ((directory_entry *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      bVar2 = std::filesystem::is_directory((path *)in_stack_fffffffffffff9b8);
      if (bVar2) {
        std::filesystem::__cxx11::recursive_directory_iterator::disable_recursion_pending();
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9c8,
                   (char *)in_stack_fffffffffffff9c0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9c8,
                   (char *)in_stack_fffffffffffff9c0);
        pcVar7 = "%s: %s %s -- skipping.\n";
        std::error_code::message_abi_cxx11_((error_code *)in_stack_fffffffffffff9c0);
        std::filesystem::__cxx11::recursive_directory_iterator::operator->
                  ((recursive_directory_iterator *)
                   CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        std::filesystem::__cxx11::directory_entry::path
                  ((directory_entry *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8))
        ;
        std::filesystem::__cxx11::path::path(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
        fs::path::path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                       (path *)0x1560ccd);
        fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffff9b0.fmt);
        in_stack_fffffffffffff9b0.fmt = pcVar7;
        in_stack_fffffffffffff9c8 = (path *)local_48;
        in_stack_fffffffffffff9c0 = (path *)(local_48 + 0x20);
        in_stack_fffffffffffff9b8 = "ListDatabases";
        in_stack_fffffffffffff9a8 = 2;
        logging_function._M_str._7_1_ = uVar8;
        logging_function._0_15_ = in_stack_fffffffffffffa70;
        source_file._M_str = in_stack_fffffffffffffa68;
        source_file._M_len = (size_t)in_stack_fffffffffffff9b0.fmt;
        in_stack_fffffffffffffa60 = (directory_entry *)in_stack_fffffffffffff9b0.fmt;
        LogPrintFormatInternal<char[14],std::__cxx11::string,std::__cxx11::string>
                  (logging_function,source_file,(int)((ulong)in_stack_fffffffffffffa18 >> 0x20),
                   CONCAT17(in_stack_fffffffffffffa17,
                            CONCAT16(in_stack_fffffffffffffa16,
                                     CONCAT15(in_stack_fffffffffffffa15,in_stack_fffffffffffffa10)))
                   ,in_stack_fffffffffffffb50,in_stack_fffffffffffffa58,in_stack_fffffffffffffb60,
                   in_stack_fffffffffffffb68,in_stack_fffffffffffffb70);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        std::filesystem::__cxx11::path::~path
                  ((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9c8,
                   (char *)in_stack_fffffffffffff9c0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9c8,
                   (char *)in_stack_fffffffffffff9c0);
        pcVar7 = "%s: %s %s\n";
        std::error_code::message_abi_cxx11_((error_code *)in_stack_fffffffffffff9c0);
        std::filesystem::__cxx11::recursive_directory_iterator::operator->
                  ((recursive_directory_iterator *)
                   CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        std::filesystem::__cxx11::directory_entry::path
                  ((directory_entry *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8))
        ;
        std::filesystem::__cxx11::path::path(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
        fs::path::path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                       (path *)0x1560ed1);
        fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffff9b0.fmt);
        in_stack_fffffffffffff9b0.fmt = pcVar7;
        in_stack_fffffffffffff9c8 = (path *)local_d8;
        in_stack_fffffffffffff9c0 = (path *)(local_d8 + 0x20);
        in_stack_fffffffffffff9b8 = "ListDatabases";
        in_stack_fffffffffffff9a8 = 2;
        logging_function_00._M_str._7_1_ = uVar8;
        logging_function_00._0_15_ = in_stack_fffffffffffffa70;
        source_file_00._M_str = in_stack_fffffffffffffa68;
        source_file_00._M_len = (size_t)in_stack_fffffffffffffa60;
        in_stack_fffffffffffffa58.fmt = in_stack_fffffffffffff9b0.fmt;
        LogPrintFormatInternal<char[14],std::__cxx11::string,std::__cxx11::string>
                  (logging_function_00,source_file_00,
                   (int)((ulong)in_stack_fffffffffffffa18 >> 0x20),
                   CONCAT17(in_stack_fffffffffffffa17,
                            CONCAT16(in_stack_fffffffffffffa16,
                                     CONCAT15(in_stack_fffffffffffffa15,in_stack_fffffffffffffa10)))
                   ,in_stack_fffffffffffffb50,in_stack_fffffffffffff9b0,in_stack_fffffffffffffb60,
                   in_stack_fffffffffffffb68,in_stack_fffffffffffffb70);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        std::filesystem::__cxx11::path::~path
                  ((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      }
    }
    else {
      std::filesystem::__cxx11::recursive_directory_iterator::operator->
                ((recursive_directory_iterator *)
                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      std::filesystem::__cxx11::directory_entry::path
                ((directory_entry *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      std::filesystem::__cxx11::path::lexically_relative(local_178);
      fs::path::path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                     (path *)0x1561077);
      std::filesystem::__cxx11::path::~path
                ((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      std::filesystem::__cxx11::recursive_directory_iterator::operator->
                ((recursive_directory_iterator *)
                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      in_stack_fffffffffffffa18 =
           std::filesystem::__cxx11::directory_entry::status
                     ((directory_entry *)in_stack_fffffffffffff9b0.fmt);
      fVar3 = std::filesystem::file_status::type
                        ((file_status *)
                         CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      if (fVar3 == directory) {
        std::filesystem::__cxx11::recursive_directory_iterator::operator->
                  ((recursive_directory_iterator *)
                   CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        std::filesystem::__cxx11::directory_entry::path
                  ((directory_entry *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8))
        ;
        std::filesystem::__cxx11::path::path(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
        fs::path::path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                       (path *)0x1561100);
        BDBDataFile(in_stack_fffffffffffff9d8);
        in_stack_fffffffffffffa17 = IsBDBFile(in_stack_fffffffffffffa08);
        fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        std::filesystem::__cxx11::path::~path
                  ((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        if ((in_stack_fffffffffffffa17 & 1) == 0) {
          std::filesystem::__cxx11::recursive_directory_iterator::operator->
                    ((recursive_directory_iterator *)
                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          std::filesystem::__cxx11::directory_entry::path
                    ((directory_entry *)
                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          std::filesystem::__cxx11::path::path(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
          fs::path::path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                         (path *)0x156129b);
          SQLiteDataFile(in_stack_fffffffffffff9d8);
          in_stack_fffffffffffffa16 = IsSQLiteFile(path_00);
          fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          std::filesystem::__cxx11::path::~path
                    ((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          if ((in_stack_fffffffffffffa16 & 1) != 0) {
            std::
            vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
            ::emplace_back<fs::path_const&,char_const(&)[7]>
                      ((vector<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff9c8,(path *)in_stack_fffffffffffff9c0,
                       (char (*) [7])in_stack_fffffffffffff9b8);
          }
        }
        else {
          std::
          vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
          ::emplace_back<fs::path_const&,char_const(&)[4]>
                    ((vector<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffff9c8,(path *)in_stack_fffffffffffff9c0,
                     (char (*) [4])in_stack_fffffffffffff9b8);
        }
      }
      else {
        iVar5 = std::filesystem::__cxx11::recursive_directory_iterator::depth();
        bVar1 = false;
        bVar2 = false;
        bVar6 = 0;
        if (iVar5 == 0) {
          std::filesystem::__cxx11::recursive_directory_iterator::operator->
                    ((recursive_directory_iterator *)
                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          in_stack_fffffffffffffa08 =
               (path *)std::filesystem::__cxx11::directory_entry::symlink_status
                                 ((directory_entry *)in_stack_fffffffffffff9b0.fmt);
          fVar3 = std::filesystem::file_status::type
                            ((file_status *)
                             CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          bVar6 = 0;
          if (fVar3 == regular) {
            std::filesystem::__cxx11::recursive_directory_iterator::operator->
                      ((recursive_directory_iterator *)
                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            std::filesystem::__cxx11::directory_entry::path
                      ((directory_entry *)
                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            std::filesystem::__cxx11::path::extension
                      ((path *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
            bVar1 = true;
            std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                      ((path *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                       (char (*) [5])in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e7);
            bVar2 = true;
            bVar4 = std::filesystem::__cxx11::operator==
                              ((path *)in_stack_fffffffffffff9b8,
                               (path *)in_stack_fffffffffffff9b0.fmt);
            bVar6 = bVar4 ^ 0xff;
          }
        }
        in_stack_fffffffffffffa15 = bVar6;
        if (bVar2) {
          std::filesystem::__cxx11::path::~path
                    ((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        }
        if (bVar1) {
          std::filesystem::__cxx11::path::~path
                    ((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        }
        if ((bVar6 & 1) != 0) {
          std::filesystem::__cxx11::recursive_directory_iterator::operator->
                    ((recursive_directory_iterator *)
                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          std::filesystem::__cxx11::directory_entry::path
                    ((directory_entry *)
                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          std::filesystem::__cxx11::path::filename(in_stack_fffffffffffff9c0);
          std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
                    ((path *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                     in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e7);
          bVar2 = std::filesystem::__cxx11::operator==
                            ((path *)in_stack_fffffffffffff9b8,(path *)in_stack_fffffffffffff9b0.fmt
                            );
          std::filesystem::__cxx11::path::~path
                    ((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          std::filesystem::__cxx11::path::~path
                    ((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          if (bVar2) {
            std::filesystem::__cxx11::recursive_directory_iterator::operator->
                      ((recursive_directory_iterator *)
                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            std::filesystem::__cxx11::directory_entry::path
                      ((directory_entry *)
                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            std::filesystem::__cxx11::path::path
                      (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
            fs::path::path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                           (path *)0x156157d);
            bVar2 = IsBDBFile(in_stack_fffffffffffffa08);
            fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            std::filesystem::__cxx11::path::~path
                      ((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            if (bVar2) {
              local_378 = 0;
              uStack_370 = 0;
              local_388 = 0;
              uStack_380 = 0;
              local_368 = 0;
              fs::path::path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
              std::
              vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
              ::emplace_back<fs::path,char_const(&)[4]>
                        ((vector<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff9c8,(path *)in_stack_fffffffffffff9c0,
                         (char (*) [4])in_stack_fffffffffffff9b8);
              fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8))
              ;
            }
            else {
              std::filesystem::__cxx11::recursive_directory_iterator::operator->
                        ((recursive_directory_iterator *)
                         CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
              std::filesystem::__cxx11::directory_entry::path
                        ((directory_entry *)
                         CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
              std::filesystem::__cxx11::path::path
                        (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
              fs::path::path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                             (path *)0x156172e);
              in_stack_fffffffffffff9f7 = IsSQLiteFile(path_00);
              fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8))
              ;
              std::filesystem::__cxx11::path::~path
                        ((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
              if ((in_stack_fffffffffffff9f7 & 1) != 0) {
                local_408[0x10] = '\0';
                local_408[0x11] = '\0';
                local_408[0x12] = '\0';
                local_408[0x13] = '\0';
                local_408[0x14] = '\0';
                local_408[0x15] = '\0';
                local_408[0x16] = '\0';
                local_408[0x17] = '\0';
                local_408[0x18] = '\0';
                local_408[0x19] = '\0';
                local_408[0x1a] = '\0';
                local_408[0x1b] = '\0';
                local_408[0x1c] = '\0';
                local_408[0x1d] = '\0';
                local_408[0x1e] = '\0';
                local_408[0x1f] = '\0';
                local_408[0] = '\0';
                local_408[1] = '\0';
                local_408[2] = '\0';
                local_408[3] = '\0';
                local_408[4] = '\0';
                local_408[5] = '\0';
                local_408[6] = '\0';
                local_408[7] = '\0';
                local_408[8] = '\0';
                local_408[9] = '\0';
                local_408[10] = '\0';
                local_408[0xb] = '\0';
                local_408[0xc] = '\0';
                local_408[0xd] = '\0';
                local_408[0xe] = '\0';
                local_408[0xf] = '\0';
                local_408[0x20] = '\0';
                local_408[0x21] = '\0';
                local_408[0x22] = '\0';
                local_408[0x23] = '\0';
                local_408[0x24] = '\0';
                local_408[0x25] = '\0';
                local_408[0x26] = '\0';
                local_408[0x27] = '\0';
                in_stack_fffffffffffff9e8 = (char (*) [11])local_408;
                fs::path::path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
                              );
                std::
                vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
                ::emplace_back<fs::path,char_const(&)[7]>
                          ((vector<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff9c8,(path *)in_stack_fffffffffffff9c0,
                           (char (*) [7])in_stack_fffffffffffff9b8);
                fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8
                                                ));
              }
            }
          }
          else {
            std::filesystem::__cxx11::recursive_directory_iterator::operator->
                      ((recursive_directory_iterator *)
                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            std::filesystem::__cxx11::directory_entry::path
                      ((directory_entry *)
                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            std::filesystem::__cxx11::path::path
                      (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
            fs::path::path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                           (path *)0x1561883);
            in_stack_fffffffffffff9e7 = IsBDBFile(in_stack_fffffffffffffa08);
            fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            std::filesystem::__cxx11::path::~path
                      ((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            if ((in_stack_fffffffffffff9e7 & generic_format) != native_format) {
              std::
              vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
              ::emplace_back<fs::path_const&,char_const(&)[4]>
                        ((vector<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff9c8,(path *)in_stack_fffffffffffff9c0,
                         (char (*) [4])in_stack_fffffffffffff9b8);
            }
          }
        }
      }
      fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
    }
    std::filesystem::__cxx11::recursive_directory_iterator::increment(&local_4e8);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_4e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<std::pair<fs::path, std::string>> ListDatabases(const fs::path& wallet_dir)
{
    std::vector<std::pair<fs::path, std::string>> paths;
    std::error_code ec;

    for (auto it = fs::recursive_directory_iterator(wallet_dir, ec); it != fs::recursive_directory_iterator(); it.increment(ec)) {
        if (ec) {
            if (fs::is_directory(*it)) {
                it.disable_recursion_pending();
                LogPrintf("%s: %s %s -- skipping.\n", __func__, ec.message(), fs::PathToString(it->path()));
            } else {
                LogPrintf("%s: %s %s\n", __func__, ec.message(), fs::PathToString(it->path()));
            }
            continue;
        }

        try {
            const fs::path path{it->path().lexically_relative(wallet_dir)};

            if (it->status().type() == fs::file_type::directory) {
                if (IsBDBFile(BDBDataFile(it->path()))) {
                    // Found a directory which contains wallet.dat btree file, add it as a wallet with BERKELEY format.
                    paths.emplace_back(path, "bdb");
                } else if (IsSQLiteFile(SQLiteDataFile(it->path()))) {
                    // Found a directory which contains wallet.dat sqlite file, add it as a wallet with SQLITE format.
                    paths.emplace_back(path, "sqlite");
                }
            } else if (it.depth() == 0 && it->symlink_status().type() == fs::file_type::regular && it->path().extension() != ".bak") {
                if (it->path().filename() == "wallet.dat") {
                    // Found top-level wallet.dat file, add top level directory ""
                    // as a wallet.
                    if (IsBDBFile(it->path())) {
                        paths.emplace_back(fs::path(), "bdb");
                    } else if (IsSQLiteFile(it->path())) {
                        paths.emplace_back(fs::path(), "sqlite");
                    }
                } else if (IsBDBFile(it->path())) {
                    // Found top-level btree file not called wallet.dat. Current bitcoin
                    // software will never create these files but will allow them to be
                    // opened in a shared database environment for backwards compatibility.
                    // Add it to the list of available wallets.
                    paths.emplace_back(path, "bdb");
                }
            }
        } catch (const std::exception& e) {
            LogPrintf("%s: Error scanning %s: %s\n", __func__, fs::PathToString(it->path()), e.what());
            it.disable_recursion_pending();
        }
    }

    return paths;
}